

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void av1_inv_txfm2d_add_8x8_sse4_1
               (int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  int8_t *piVar2;
  int fliplr;
  undefined7 in_register_00000009;
  int flipud;
  int in_R9D;
  __m128i out [16];
  __m128i in [16];
  longlong local_238 [32];
  longlong local_138;
  longlong lStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar2 = av1_inv_txfm_shift_ls[1];
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    local_138 = *(longlong *)input;
    lStack_130 = *(longlong *)(input + 2);
    local_128 = *(undefined8 *)(input + 4);
    uStack_120 = *(undefined8 *)(input + 6);
    local_118 = *(undefined8 *)(input + 8);
    uStack_110 = *(undefined8 *)(input + 10);
    local_108 = *(undefined8 *)(input + 0xc);
    uStack_100 = *(undefined8 *)(input + 0xe);
    local_f8 = *(undefined8 *)(input + 0x10);
    uStack_f0 = *(undefined8 *)(input + 0x12);
    local_e8 = *(undefined8 *)(input + 0x14);
    uStack_e0 = *(undefined8 *)(input + 0x16);
    local_d8 = *(undefined8 *)(input + 0x18);
    uStack_d0 = *(undefined8 *)(input + 0x1a);
    local_c8 = *(undefined8 *)(input + 0x1c);
    uStack_c0 = *(undefined8 *)(input + 0x1e);
    local_b8 = *(undefined8 *)(input + 0x20);
    uStack_b0 = *(undefined8 *)(input + 0x22);
    local_a8 = *(undefined8 *)(input + 0x24);
    uStack_a0 = *(undefined8 *)(input + 0x26);
    local_98 = *(undefined8 *)(input + 0x28);
    uStack_90 = *(undefined8 *)(input + 0x2a);
    local_88 = *(undefined8 *)(input + 0x2c);
    uStack_80 = *(undefined8 *)(input + 0x2e);
    local_78 = *(undefined8 *)(input + 0x30);
    uStack_70 = *(undefined8 *)(input + 0x32);
    local_68 = *(undefined8 *)(input + 0x34);
    uStack_60 = *(undefined8 *)(input + 0x36);
    local_58 = *(undefined8 *)(input + 0x38);
    uStack_50 = *(undefined8 *)(input + 0x3a);
    local_48 = *(undefined8 *)(input + 0x3c);
    uStack_40 = *(undefined8 *)(input + 0x3e);
    idct8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,0,bd,-(int)*av1_inv_txfm_shift_ls[1],
                   in_R9D);
    break;
  case 1:
    local_138 = *(longlong *)input;
    lStack_130 = *(longlong *)(input + 2);
    local_128 = *(undefined8 *)(input + 4);
    uStack_120 = *(undefined8 *)(input + 6);
    local_118 = *(undefined8 *)(input + 8);
    uStack_110 = *(undefined8 *)(input + 10);
    local_108 = *(undefined8 *)(input + 0xc);
    uStack_100 = *(undefined8 *)(input + 0xe);
    local_f8 = *(undefined8 *)(input + 0x10);
    uStack_f0 = *(undefined8 *)(input + 0x12);
    local_e8 = *(undefined8 *)(input + 0x14);
    uStack_e0 = *(undefined8 *)(input + 0x16);
    local_d8 = *(undefined8 *)(input + 0x18);
    uStack_d0 = *(undefined8 *)(input + 0x1a);
    local_c8 = *(undefined8 *)(input + 0x1c);
    uStack_c0 = *(undefined8 *)(input + 0x1e);
    local_b8 = *(undefined8 *)(input + 0x20);
    uStack_b0 = *(undefined8 *)(input + 0x22);
    local_a8 = *(undefined8 *)(input + 0x24);
    uStack_a0 = *(undefined8 *)(input + 0x26);
    local_98 = *(undefined8 *)(input + 0x28);
    uStack_90 = *(undefined8 *)(input + 0x2a);
    local_88 = *(undefined8 *)(input + 0x2c);
    uStack_80 = *(undefined8 *)(input + 0x2e);
    local_78 = *(undefined8 *)(input + 0x30);
    uStack_70 = *(undefined8 *)(input + 0x32);
    local_68 = *(undefined8 *)(input + 0x34);
    uStack_60 = *(undefined8 *)(input + 0x36);
    local_58 = *(undefined8 *)(input + 0x38);
    uStack_50 = *(undefined8 *)(input + 0x3a);
    local_48 = *(undefined8 *)(input + 0x3c);
    uStack_40 = *(undefined8 *)(input + 0x3e);
    idct8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,0,bd,-(int)*av1_inv_txfm_shift_ls[1],
                   in_R9D);
    goto LAB_003f3e5d;
  case 2:
    local_138 = *(longlong *)input;
    lStack_130 = *(longlong *)(input + 2);
    local_128 = *(undefined8 *)(input + 4);
    uStack_120 = *(undefined8 *)(input + 6);
    local_118 = *(undefined8 *)(input + 8);
    uStack_110 = *(undefined8 *)(input + 10);
    local_108 = *(undefined8 *)(input + 0xc);
    uStack_100 = *(undefined8 *)(input + 0xe);
    local_f8 = *(undefined8 *)(input + 0x10);
    uStack_f0 = *(undefined8 *)(input + 0x12);
    local_e8 = *(undefined8 *)(input + 0x14);
    uStack_e0 = *(undefined8 *)(input + 0x16);
    local_d8 = *(undefined8 *)(input + 0x18);
    uStack_d0 = *(undefined8 *)(input + 0x1a);
    local_c8 = *(undefined8 *)(input + 0x1c);
    uStack_c0 = *(undefined8 *)(input + 0x1e);
    local_b8 = *(undefined8 *)(input + 0x20);
    uStack_b0 = *(undefined8 *)(input + 0x22);
    local_a8 = *(undefined8 *)(input + 0x24);
    uStack_a0 = *(undefined8 *)(input + 0x26);
    local_98 = *(undefined8 *)(input + 0x28);
    uStack_90 = *(undefined8 *)(input + 0x2a);
    local_88 = *(undefined8 *)(input + 0x2c);
    uStack_80 = *(undefined8 *)(input + 0x2e);
    local_78 = *(undefined8 *)(input + 0x30);
    uStack_70 = *(undefined8 *)(input + 0x32);
    local_68 = *(undefined8 *)(input + 0x34);
    uStack_60 = *(undefined8 *)(input + 0x36);
    local_58 = *(undefined8 *)(input + 0x38);
    uStack_50 = *(undefined8 *)(input + 0x3a);
    local_48 = *(undefined8 *)(input + 0x3c);
    uStack_40 = *(undefined8 *)(input + 0x3e);
    iadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,0,bd,-(int)*av1_inv_txfm_shift_ls[1],
                    in_R9D);
    break;
  case 3:
    local_138 = *(longlong *)input;
    lStack_130 = *(longlong *)(input + 2);
    local_128 = *(undefined8 *)(input + 4);
    uStack_120 = *(undefined8 *)(input + 6);
    local_118 = *(undefined8 *)(input + 8);
    uStack_110 = *(undefined8 *)(input + 10);
    local_108 = *(undefined8 *)(input + 0xc);
    uStack_100 = *(undefined8 *)(input + 0xe);
    local_f8 = *(undefined8 *)(input + 0x10);
    uStack_f0 = *(undefined8 *)(input + 0x12);
    local_e8 = *(undefined8 *)(input + 0x14);
    uStack_e0 = *(undefined8 *)(input + 0x16);
    local_d8 = *(undefined8 *)(input + 0x18);
    uStack_d0 = *(undefined8 *)(input + 0x1a);
    local_c8 = *(undefined8 *)(input + 0x1c);
    uStack_c0 = *(undefined8 *)(input + 0x1e);
    local_b8 = *(undefined8 *)(input + 0x20);
    uStack_b0 = *(undefined8 *)(input + 0x22);
    local_a8 = *(undefined8 *)(input + 0x24);
    uStack_a0 = *(undefined8 *)(input + 0x26);
    local_98 = *(undefined8 *)(input + 0x28);
    uStack_90 = *(undefined8 *)(input + 0x2a);
    local_88 = *(undefined8 *)(input + 0x2c);
    uStack_80 = *(undefined8 *)(input + 0x2e);
    local_78 = *(undefined8 *)(input + 0x30);
    uStack_70 = *(undefined8 *)(input + 0x32);
    local_68 = *(undefined8 *)(input + 0x34);
    uStack_60 = *(undefined8 *)(input + 0x36);
    local_58 = *(undefined8 *)(input + 0x38);
    uStack_50 = *(undefined8 *)(input + 0x3a);
    local_48 = *(undefined8 *)(input + 0x3c);
    uStack_40 = *(undefined8 *)(input + 0x3e);
    iadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,0,bd,-(int)*av1_inv_txfm_shift_ls[1],
                    in_R9D);
LAB_003f3e5d:
    iadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,1,bd,0,in_R9D);
    goto LAB_003f3fe8;
  case 4:
    local_138 = *(longlong *)input;
    lStack_130 = *(longlong *)(input + 2);
    local_128 = *(undefined8 *)(input + 4);
    uStack_120 = *(undefined8 *)(input + 6);
    local_118 = *(undefined8 *)(input + 8);
    uStack_110 = *(undefined8 *)(input + 10);
    local_108 = *(undefined8 *)(input + 0xc);
    uStack_100 = *(undefined8 *)(input + 0xe);
    local_f8 = *(undefined8 *)(input + 0x10);
    uStack_f0 = *(undefined8 *)(input + 0x12);
    local_e8 = *(undefined8 *)(input + 0x14);
    uStack_e0 = *(undefined8 *)(input + 0x16);
    local_d8 = *(undefined8 *)(input + 0x18);
    uStack_d0 = *(undefined8 *)(input + 0x1a);
    local_c8 = *(undefined8 *)(input + 0x1c);
    uStack_c0 = *(undefined8 *)(input + 0x1e);
    local_b8 = *(undefined8 *)(input + 0x20);
    uStack_b0 = *(undefined8 *)(input + 0x22);
    local_a8 = *(undefined8 *)(input + 0x24);
    uStack_a0 = *(undefined8 *)(input + 0x26);
    local_98 = *(undefined8 *)(input + 0x28);
    uStack_90 = *(undefined8 *)(input + 0x2a);
    local_88 = *(undefined8 *)(input + 0x2c);
    uStack_80 = *(undefined8 *)(input + 0x2e);
    local_78 = *(undefined8 *)(input + 0x30);
    uStack_70 = *(undefined8 *)(input + 0x32);
    local_68 = *(undefined8 *)(input + 0x34);
    uStack_60 = *(undefined8 *)(input + 0x36);
    local_58 = *(undefined8 *)(input + 0x38);
    uStack_50 = *(undefined8 *)(input + 0x3a);
    local_48 = *(undefined8 *)(input + 0x3c);
    uStack_40 = *(undefined8 *)(input + 0x3e);
    idct8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,0,bd,-(int)*av1_inv_txfm_shift_ls[1],
                   in_R9D);
    goto LAB_003f45fb;
  case 5:
    local_138 = *(longlong *)input;
    lStack_130 = *(longlong *)(input + 2);
    local_128 = *(undefined8 *)(input + 4);
    uStack_120 = *(undefined8 *)(input + 6);
    local_118 = *(undefined8 *)(input + 8);
    uStack_110 = *(undefined8 *)(input + 10);
    local_108 = *(undefined8 *)(input + 0xc);
    uStack_100 = *(undefined8 *)(input + 0xe);
    local_f8 = *(undefined8 *)(input + 0x10);
    uStack_f0 = *(undefined8 *)(input + 0x12);
    local_e8 = *(undefined8 *)(input + 0x14);
    uStack_e0 = *(undefined8 *)(input + 0x16);
    local_d8 = *(undefined8 *)(input + 0x18);
    uStack_d0 = *(undefined8 *)(input + 0x1a);
    local_c8 = *(undefined8 *)(input + 0x1c);
    uStack_c0 = *(undefined8 *)(input + 0x1e);
    local_b8 = *(undefined8 *)(input + 0x20);
    uStack_b0 = *(undefined8 *)(input + 0x22);
    local_a8 = *(undefined8 *)(input + 0x24);
    uStack_a0 = *(undefined8 *)(input + 0x26);
    local_98 = *(undefined8 *)(input + 0x28);
    uStack_90 = *(undefined8 *)(input + 0x2a);
    local_88 = *(undefined8 *)(input + 0x2c);
    uStack_80 = *(undefined8 *)(input + 0x2e);
    local_78 = *(undefined8 *)(input + 0x30);
    uStack_70 = *(undefined8 *)(input + 0x32);
    local_68 = *(undefined8 *)(input + 0x34);
    uStack_60 = *(undefined8 *)(input + 0x36);
    local_58 = *(undefined8 *)(input + 0x38);
    uStack_50 = *(undefined8 *)(input + 0x3a);
    local_48 = *(undefined8 *)(input + 0x3c);
    uStack_40 = *(undefined8 *)(input + 0x3e);
    iadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,0,bd,-(int)*av1_inv_txfm_shift_ls[1],
                    in_R9D);
    idct8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,1,bd,0,in_R9D);
    goto LAB_003f426f;
  case 6:
    local_138 = *(longlong *)input;
    lStack_130 = *(longlong *)(input + 2);
    local_128 = *(undefined8 *)(input + 4);
    uStack_120 = *(undefined8 *)(input + 6);
    local_118 = *(undefined8 *)(input + 8);
    uStack_110 = *(undefined8 *)(input + 10);
    local_108 = *(undefined8 *)(input + 0xc);
    uStack_100 = *(undefined8 *)(input + 0xe);
    local_f8 = *(undefined8 *)(input + 0x10);
    uStack_f0 = *(undefined8 *)(input + 0x12);
    local_e8 = *(undefined8 *)(input + 0x14);
    uStack_e0 = *(undefined8 *)(input + 0x16);
    local_d8 = *(undefined8 *)(input + 0x18);
    uStack_d0 = *(undefined8 *)(input + 0x1a);
    local_c8 = *(undefined8 *)(input + 0x1c);
    uStack_c0 = *(undefined8 *)(input + 0x1e);
    local_b8 = *(undefined8 *)(input + 0x20);
    uStack_b0 = *(undefined8 *)(input + 0x22);
    local_a8 = *(undefined8 *)(input + 0x24);
    uStack_a0 = *(undefined8 *)(input + 0x26);
    local_98 = *(undefined8 *)(input + 0x28);
    uStack_90 = *(undefined8 *)(input + 0x2a);
    local_88 = *(undefined8 *)(input + 0x2c);
    uStack_80 = *(undefined8 *)(input + 0x2e);
    local_78 = *(undefined8 *)(input + 0x30);
    uStack_70 = *(undefined8 *)(input + 0x32);
    local_68 = *(undefined8 *)(input + 0x34);
    uStack_60 = *(undefined8 *)(input + 0x36);
    local_58 = *(undefined8 *)(input + 0x38);
    uStack_50 = *(undefined8 *)(input + 0x3a);
    local_48 = *(undefined8 *)(input + 0x3c);
    uStack_40 = *(undefined8 *)(input + 0x3e);
    iadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,0,bd,-(int)*av1_inv_txfm_shift_ls[1],
                    in_R9D);
    iadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,1,bd,0,in_R9D);
    cVar1 = piVar2[1];
    fliplr = 1;
    goto LAB_003f479b;
  case 7:
    local_138 = *(longlong *)input;
    lStack_130 = *(longlong *)(input + 2);
    local_128 = *(undefined8 *)(input + 4);
    uStack_120 = *(undefined8 *)(input + 6);
    local_118 = *(undefined8 *)(input + 8);
    uStack_110 = *(undefined8 *)(input + 10);
    local_108 = *(undefined8 *)(input + 0xc);
    uStack_100 = *(undefined8 *)(input + 0xe);
    local_f8 = *(undefined8 *)(input + 0x10);
    uStack_f0 = *(undefined8 *)(input + 0x12);
    local_e8 = *(undefined8 *)(input + 0x14);
    uStack_e0 = *(undefined8 *)(input + 0x16);
    local_d8 = *(undefined8 *)(input + 0x18);
    uStack_d0 = *(undefined8 *)(input + 0x1a);
    local_c8 = *(undefined8 *)(input + 0x1c);
    uStack_c0 = *(undefined8 *)(input + 0x1e);
    local_b8 = *(undefined8 *)(input + 0x20);
    uStack_b0 = *(undefined8 *)(input + 0x22);
    local_a8 = *(undefined8 *)(input + 0x24);
    uStack_a0 = *(undefined8 *)(input + 0x26);
    local_98 = *(undefined8 *)(input + 0x28);
    uStack_90 = *(undefined8 *)(input + 0x2a);
    local_88 = *(undefined8 *)(input + 0x2c);
    uStack_80 = *(undefined8 *)(input + 0x2e);
    local_78 = *(undefined8 *)(input + 0x30);
    uStack_70 = *(undefined8 *)(input + 0x32);
    local_68 = *(undefined8 *)(input + 0x34);
    uStack_60 = *(undefined8 *)(input + 0x36);
    local_58 = *(undefined8 *)(input + 0x38);
    uStack_50 = *(undefined8 *)(input + 0x3a);
    local_48 = *(undefined8 *)(input + 0x3c);
    uStack_40 = *(undefined8 *)(input + 0x3e);
    iadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,0,bd,-(int)*av1_inv_txfm_shift_ls[1],
                    in_R9D);
    iadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,1,bd,0,in_R9D);
LAB_003f426f:
    cVar1 = piVar2[1];
    fliplr = 1;
    goto LAB_003f4287;
  case 8:
    local_138 = *(longlong *)input;
    lStack_130 = *(longlong *)(input + 2);
    local_128 = *(undefined8 *)(input + 4);
    uStack_120 = *(undefined8 *)(input + 6);
    local_118 = *(undefined8 *)(input + 8);
    uStack_110 = *(undefined8 *)(input + 10);
    local_108 = *(undefined8 *)(input + 0xc);
    uStack_100 = *(undefined8 *)(input + 0xe);
    local_f8 = *(undefined8 *)(input + 0x10);
    uStack_f0 = *(undefined8 *)(input + 0x12);
    local_e8 = *(undefined8 *)(input + 0x14);
    uStack_e0 = *(undefined8 *)(input + 0x16);
    local_d8 = *(undefined8 *)(input + 0x18);
    uStack_d0 = *(undefined8 *)(input + 0x1a);
    local_c8 = *(undefined8 *)(input + 0x1c);
    uStack_c0 = *(undefined8 *)(input + 0x1e);
    local_b8 = *(undefined8 *)(input + 0x20);
    uStack_b0 = *(undefined8 *)(input + 0x22);
    local_a8 = *(undefined8 *)(input + 0x24);
    uStack_a0 = *(undefined8 *)(input + 0x26);
    local_98 = *(undefined8 *)(input + 0x28);
    uStack_90 = *(undefined8 *)(input + 0x2a);
    local_88 = *(undefined8 *)(input + 0x2c);
    uStack_80 = *(undefined8 *)(input + 0x2e);
    local_78 = *(undefined8 *)(input + 0x30);
    uStack_70 = *(undefined8 *)(input + 0x32);
    local_68 = *(undefined8 *)(input + 0x34);
    uStack_60 = *(undefined8 *)(input + 0x36);
    local_58 = *(undefined8 *)(input + 0x38);
    uStack_50 = *(undefined8 *)(input + 0x3a);
    local_48 = *(undefined8 *)(input + 0x3c);
    uStack_40 = *(undefined8 *)(input + 0x3e);
    iadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,0,bd,-(int)*av1_inv_txfm_shift_ls[1],
                    in_R9D);
LAB_003f45fb:
    iadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,1,bd,0,in_R9D);
    cVar1 = piVar2[1];
    fliplr = 0;
LAB_003f479b:
    flipud = 1;
    goto LAB_003f47a1;
  default:
    goto switchD_003f35e0_default;
  }
  idct8x8_sse4_1((__m128i *)&local_138,(__m128i *)local_238,1,bd,0,in_R9D);
LAB_003f3fe8:
  cVar1 = piVar2[1];
  fliplr = 0;
LAB_003f4287:
  flipud = 0;
LAB_003f47a1:
  write_buffer_8x8((__m128i *)local_238,output,stride,fliplr,flipud,-(int)cVar1,bd);
switchD_003f35e0_default:
  return;
}

Assistant:

void av1_inv_txfm2d_add_8x8_sse4_1(const int32_t *input, uint16_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  __m128i in[16], out[16];
  const int8_t *shift = av1_inv_txfm_shift_ls[TX_8X8];

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_8x8(input, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 0, -shift[1], bd);
      break;
    case DCT_ADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 0, -shift[1], bd);
      break;
    case ADST_DCT:
      load_buffer_8x8(input, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 0, -shift[1], bd);
      break;
    case ADST_ADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 0, -shift[1], bd);
      break;
    case FLIPADST_DCT:
      load_buffer_8x8(input, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 1, -shift[1], bd);
      break;
    case DCT_FLIPADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 1, 0, -shift[1], bd);
      break;
    case ADST_FLIPADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 1, 0, -shift[1], bd);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 1, 1, -shift[1], bd);
      break;
    case FLIPADST_ADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 1, -shift[1], bd);
      break;
    default: assert(0);
  }
}